

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_protobuf.h
# Opt level: O2

bool __thiscall
ec::base_protobuf::
out_varint<unsigned_long,std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>,void>
          (base_protobuf *this,unsigned_long v,
          basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
          *pout)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  
  uVar2 = 0;
  do {
    uVar3 = v >> ((byte)(uVar2 + 7) & 0x3f);
    bVar1 = (byte)(v >> ((byte)uVar2 & 0x3f));
    if (uVar3 == 0) {
      std::__cxx11::
      basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>::
      push_back(pout,bVar1 & 0x7f);
      return true;
    }
    std::__cxx11::
    basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>::
    push_back(pout,bVar1 | 0x80);
    bVar4 = uVar2 < 0x32;
    uVar2 = uVar2 + 7;
  } while (bVar4);
  std::__cxx11::
  basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>::
  push_back(pout,(uchar)uVar3);
  return true;
}

Assistant:

bool out_varint(_Tp v, _Out *pout) //out Varint (Base 128 Varints)
    {
        int nbit = 0;
        uint8_t out = 0;

        do {
            out = (v >> nbit) & 0x7F;
            nbit += 7;

            if (v >> nbit) {
                out |= 0x80;
                pout->push_back(out);
            } else {
                pout->push_back(out);
                break;
            }
        } while (nbit + 7 < ((int)sizeof(_Tp) * 8));

        if (v >> nbit) {
            try {
                pout->push_back((uint8_t)(v >> nbit));
            } catch (...) {
                _lasterr = pberr_memory;
                return false;
            }
        }

        return true;
    }